

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content_chunked(Stream *strm,ContentReceiver *out)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  char **ppcVar5;
  FILE *__stream;
  size_t *__n;
  size_t *extraout_RDX;
  size_t *__n_00;
  size_t *__n_01;
  size_t *__n_02;
  size_t *extraout_RDX_00;
  Stream *__lineptr;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f8 [71];
  allocator<char> local_b1;
  string local_b0;
  int local_8c;
  int local_88;
  int chunk_len;
  undefined1 local_78 [8];
  stream_line_reader line_reader;
  char buf [16];
  int bufsiz;
  ContentReceiver *out_local;
  Stream *strm_local;
  
  __stream = (FILE *)0x10;
  __lineptr = strm;
  stream_line_reader::stream_line_reader
            ((stream_line_reader *)local_78,strm,
             line_reader.glowable_buffer_.field_2._M_local_buf + 8,0x10);
  uVar3 = stream_line_reader::getline
                    ((stream_line_reader *)local_78,(char **)__lineptr,__n,__stream);
  if ((uVar3 & 1) == 0) {
    strm_local._7_1_ = false;
    goto LAB_001dd595;
  }
  pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar4,&local_b1);
  ppcVar5 = (char **)0x0;
  iVar2 = std::__cxx11::stoi(&local_b0,(size_t *)0x0,0x10);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  __n_00 = extraout_RDX;
  local_8c = iVar2;
  while (0 < local_8c) {
    ppcVar5 = (char **)(long)local_8c;
    std::function<bool_(unsigned_long,_unsigned_long)>::function
              ((function<bool_(unsigned_long,_unsigned_long)> *)(local_f8 + 0x20),(nullptr_t)0x0);
    std::function<bool_(const_char_*,_unsigned_long)>::function
              ((function<bool_(const_char_*,_unsigned_long)> *)local_f8,out);
    __stream = (FILE *)local_f8;
    bVar1 = read_content_with_length
                      (strm,(uint64_t)ppcVar5,(Progress *)(local_f8 + 0x20),
                       (ContentReceiver *)__stream);
    std::function<bool_(const_char_*,_unsigned_long)>::~function
              ((function<bool_(const_char_*,_unsigned_long)> *)local_f8);
    std::function<bool_(unsigned_long,_unsigned_long)>::~function
              ((function<bool_(unsigned_long,_unsigned_long)> *)(local_f8 + 0x20));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      strm_local._7_1_ = false;
      goto LAB_001dd595;
    }
    uVar3 = stream_line_reader::getline((stream_line_reader *)local_78,ppcVar5,__n_01,__stream);
    if ((uVar3 & 1) == 0) {
      strm_local._7_1_ = false;
      goto LAB_001dd595;
    }
    pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_78);
    ppcVar5 = (char **)0x47c754;
    iVar2 = strcmp(pcVar4,"\r\n");
    __n_00 = __n_02;
    if (iVar2 != 0) break;
    uVar3 = stream_line_reader::getline((stream_line_reader *)local_78,ppcVar5,__n_02,__stream);
    if ((uVar3 & 1) == 0) {
      strm_local._7_1_ = false;
      goto LAB_001dd595;
    }
    pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,pcVar4,&local_119);
    ppcVar5 = (char **)0x0;
    local_8c = std::__cxx11::stoi(&local_118,(size_t *)0x0,0x10);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    __n_00 = extraout_RDX_00;
  }
  if (local_8c == 0) {
    uVar3 = stream_line_reader::getline((stream_line_reader *)local_78,ppcVar5,__n_00,__stream);
    if ((uVar3 & 1) != 0) {
      pcVar4 = stream_line_reader::ptr((stream_line_reader *)local_78);
      iVar2 = strcmp(pcVar4,"\r\n");
      if (iVar2 == 0) goto LAB_001dd58a;
    }
    strm_local._7_1_ = false;
  }
  else {
LAB_001dd58a:
    strm_local._7_1_ = true;
  }
LAB_001dd595:
  local_88 = 1;
  stream_line_reader::~stream_line_reader((stream_line_reader *)local_78);
  return strm_local._7_1_;
}

Assistant:

inline bool read_content_chunked(Stream &strm, ContentReceiver out) {
  const auto bufsiz = 16;
  char buf[bufsiz];

  stream_line_reader line_reader(strm, buf, bufsiz);

  if (!line_reader.getline()) { return false; }

  auto chunk_len = std::stoi(line_reader.ptr(), 0, 16);

  while (chunk_len > 0) {
    if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
      return false;
    }

    if (!line_reader.getline()) { return false; }

    if (strcmp(line_reader.ptr(), "\r\n")) { break; }

    if (!line_reader.getline()) { return false; }

    chunk_len = std::stoi(line_reader.ptr(), 0, 16);
  }

  if (chunk_len == 0) {
    // Reader terminator after chunks
    if (!line_reader.getline() || strcmp(line_reader.ptr(), "\r\n"))
      return false;
  }

  return true;
}